

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O1

void __thiscall
slang::ast::Constraint::visit<slang::ast::DistVarVisitor>(Constraint *this,DistVarVisitor *visitor)

{
  logic_error *this_00;
  long *plVar1;
  size_type *psVar2;
  long *plVar3;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (this->kind < (Foreach|List)) {
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
             ,"");
  plVar1 = (long *)std::__cxx11::string::append((char *)local_90);
  local_d0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_d0._M_dataplus._M_p == psVar2) {
    local_d0.field_2._M_allocated_capacity = *psVar2;
    local_d0.field_2._8_8_ = plVar1[3];
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar2;
  }
  local_d0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x181);
  std::operator+(&local_50,&local_d0,&local_70);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_b0 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_b0 == plVar3) {
    local_a0 = *plVar3;
    lStack_98 = plVar1[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar3;
  }
  local_a8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_f0 = (long *)*plVar1;
  plVar3 = plVar1 + 2;
  if (local_f0 == plVar3) {
    local_e0 = *plVar3;
    lStack_d8 = plVar1[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar3;
  }
  local_e8 = plVar1[1];
  *plVar1 = (long)plVar3;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

decltype(auto) Constraint::visit(TVisitor& visitor, Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ConstraintKind::k: return visitor.visit(*static_cast<const n*>(this), std::forward<Args>(args)...)
    switch (kind) {
        case ConstraintKind::Invalid: return visitor.visit(*this, std::forward<Args>(args)...);
        CASE(List, ConstraintList);
        CASE(Expression, ExpressionConstraint);
        CASE(Implication, ImplicationConstraint);
        CASE(Conditional, ConditionalConstraint);
        CASE(Uniqueness, UniquenessConstraint);
        CASE(DisableSoft, DisableSoftConstraint);
        CASE(SolveBefore, SolveBeforeConstraint);
        CASE(Foreach, ForeachConstraint);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}